

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumn,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcBuildingElement *this;
  
  this = (IfcBuildingElement *)operator_new(0x170);
  *(undefined ***)&this->field_0x158 = &PTR__Object_00816a50;
  *(undefined8 *)&this[1].super_IfcElement.super_IfcProduct.super_IfcObject = 0;
  *(char **)&this[1].super_IfcElement.super_IfcProduct.super_IfcObject.field_0x8 = "IfcColumn";
  Assimp::IFC::Schema_2x3::IfcBuildingElement::IfcBuildingElement
            (this,&PTR_construction_vtable_24__00833b58);
  *(undefined ***)&(this->super_IfcElement).super_IfcProduct.super_IfcObject =
       &PTR__IfcColumn_00833a28;
  *(undefined ***)&this->field_0x158 = &PTR__IfcColumn_00833b40;
  *(undefined ***)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x88 =
       &PTR__IfcColumn_00833a50;
  (this->super_IfcElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcColumn_00833a78;
  *(undefined ***)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0xd0 =
       &PTR__IfcColumn_00833aa0;
  *(undefined ***)&(this->super_IfcElement).super_IfcProduct.field_0x100 = &PTR__IfcColumn_00833ac8;
  *(undefined ***)&(this->super_IfcElement).field_0x138 = &PTR__IfcColumn_00833af0;
  *(undefined ***)&(this->super_IfcElement).field_0x148 = &PTR__IfcColumn_00833b18;
  GenericFill<Assimp::IFC::Schema_2x3::IfcBuildingElement>(db,params,this);
  return (Object *)
         (&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x0 +
         *(long *)(*(long *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }